

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(),_chaiscript::dispatch::detail::Constructor<unsigned_short>_>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(),_chaiscript::dispatch::detail::Constructor<unsigned_short>_>
           *this,undefined8 param_2,_func_shared_ptr<unsigned_short> *param_3)

{
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> _Stack_28;
  
  detail::build_param_type_list<std::shared_ptr<unsigned_short>>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&_Stack_28,
             (detail *)0x0,param_3);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)this,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&_Stack_28);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&_Stack_28);
  *(undefined ***)this = &PTR__Proxy_Function_Base_00326958;
  return;
}

Assistant:

Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr))),
            m_f(std::move(f))
        {
        }